

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O2

TypedDeleter<LLVMBC::ExtractElementInst> * __thiscall
LLVMBC::LLVMContext::
construct_trivial<LLVMBC::LLVMContext::TypedDeleter<LLVMBC::ExtractElementInst>,LLVMBC::ExtractElementInst*&>
          (LLVMContext *this,ExtractElementInst **u)

{
  ExtractElementInst *pEVar1;
  TypedDeleter<LLVMBC::ExtractElementInst> *pTVar2;
  
  pTVar2 = (TypedDeleter<LLVMBC::ExtractElementInst> *)allocate(this,0x10,8);
  if (pTVar2 != (TypedDeleter<LLVMBC::ExtractElementInst> *)0x0) {
    pEVar1 = *u;
    (pTVar2->super_Deleter)._vptr_Deleter = (_func_int **)&PTR__Deleter_001e39c0;
    pTVar2->ptr = pEVar1;
    return pTVar2;
  }
  std::terminate();
}

Assistant:

T *construct_trivial(U &&... u)
	{
		T *mem = static_cast<T *>(allocate(sizeof(T), alignof(T)));
		if (!mem)
			std::terminate();
		T *t = new (mem) T(std::forward<U>(u)...);
		return t;
	}